

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getRowsBySet(void *highs,HighsInt num_set_entries,HighsInt *set,HighsInt *num_row,
                           double *lower,double *upper,HighsInt *num_nz,HighsInt *matrix_start,
                           HighsInt *matrix_index,double *matrix_value)

{
  HighsStatus HVar1;
  undefined4 *in_RCX;
  undefined4 *in_stack_00000008;
  HighsStatus status;
  HighsInt local_num_nz;
  HighsInt local_num_row;
  double *in_stack_000000c0;
  double *in_stack_000000c8;
  HighsInt *in_stack_000000d0;
  HighsInt *in_stack_000000d8;
  HighsInt in_stack_000000e4;
  Highs *in_stack_000000e8;
  HighsInt *in_stack_00000100;
  HighsInt *in_stack_00000108;
  HighsInt *in_stack_00000110;
  double *in_stack_00000118;
  undefined4 local_40;
  undefined4 local_3c;
  
  HVar1 = Highs::getRows(in_stack_000000e8,in_stack_000000e4,in_stack_000000d8,in_stack_000000d0,
                         in_stack_000000c8,in_stack_000000c0,in_stack_00000100,in_stack_00000108,
                         in_stack_00000110,in_stack_00000118);
  *in_RCX = local_3c;
  *in_stack_00000008 = local_40;
  return HVar1;
}

Assistant:

HighsInt Highs_getRowsBySet(const void* highs, const HighsInt num_set_entries,
                            const HighsInt* set, HighsInt* num_row,
                            double* lower, double* upper, HighsInt* num_nz,
                            HighsInt* matrix_start, HighsInt* matrix_index,
                            double* matrix_value) {
  HighsInt local_num_row, local_num_nz;
  HighsStatus status =
      ((Highs*)highs)
          ->getRows(num_set_entries, set, local_num_row, lower, upper,
                    local_num_nz, matrix_start, matrix_index, matrix_value);
  *num_row = local_num_row;
  *num_nz = local_num_nz;
  return (HighsInt)status;
}